

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.hpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run::_run
          (_run *this)

{
  _run *this_local;
  
  this->bo_indices_id = 0;
  this->drawcall_count_multiplier = 0;
  this->drawcall_is_indiced = false;
  this->drawcall_n_instances = 0;
  this->n_result_vertices = 0;
  this->n_instances = 0;
  this->n_patch_vertices = 0;
  this->n_restart_indices = 0;
  this->po_id = 0;
  this->primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
  this->tc_id = 0;
  this->te_id = 0;
  return;
}

Assistant:

_run()
		{
			bo_indices_id			  = 0;
			drawcall_count_multiplier = 0;
			drawcall_is_indiced		  = false;
			drawcall_n_instances	  = 0;
			n_result_vertices		  = 0;
			n_instances				  = 0;
			n_patch_vertices		  = 0;
			n_restart_indices		  = 0;
			po_id					  = 0;
			primitive_mode			  = TESSELLATION_SHADER_PRIMITIVE_MODE_UNKNOWN;
			tc_id					  = 0;
			te_id					  = 0;
		}